

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPolyn.c
# Opt level: O3

void Gia_PolynBuildAdd(Pln_Man_t *p,Vec_Int_t *vTempC,Vec_Int_t *vTempM)

{
  size_t sVar1;
  uint uVar2;
  Vec_Flt_t *pVVar3;
  Vec_Que_t *pVVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  float *pfVar11;
  int *piVar12;
  int *piVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  int iVar18;
  long lVar19;
  uint uVar20;
  Hsh_VecMan_t *p_00;
  ulong uVar21;
  ulong uVar23;
  uint uVar24;
  int iVar25;
  uint uVar26;
  float fVar27;
  float fVar28;
  ulong uVar22;
  
  if (vTempM == (Vec_Int_t *)0x0) {
    uVar21 = 0;
  }
  else {
    uVar7 = Hsh_VecManAdd(p->pHashM,vTempM);
    uVar21 = (ulong)uVar7;
  }
  p->nBuilds = p->nBuilds + 1;
  iVar8 = p->vCoefs->nSize;
  iVar18 = (int)uVar21;
  if (iVar18 == iVar8) {
    iVar8 = Hsh_VecManAdd(p->pHashC,vTempC);
    Vec_IntPush(p->vCoefs,iVar8);
    if ((long)vTempM->nSize < 1) {
      __assert_fail("p->nSize > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x1f8,"int Vec_IntEntryLast(Vec_Int_t *)");
    }
    iVar25 = vTempM->pArray[(long)vTempM->nSize + -1];
    if (((long)iVar25 < 0) || (p->vOrder->nSize <= iVar25)) {
LAB_005e7b1d:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar25 = p->vOrder->pArray[iVar25];
    pVVar3 = p->vCounts;
    uVar7 = pVVar3->nSize;
    if (uVar7 == pVVar3->nCap) {
      if ((int)uVar7 < 0x10) {
        if (pVVar3->pArray == (float *)0x0) {
          pfVar11 = (float *)malloc(0x40);
        }
        else {
          pfVar11 = (float *)realloc(pVVar3->pArray,0x40);
        }
        pVVar3->pArray = pfVar11;
        pVVar3->nCap = 0x10;
      }
      else {
        if (pVVar3->pArray == (float *)0x0) {
          pfVar11 = (float *)malloc((ulong)uVar7 << 3);
        }
        else {
          pfVar11 = (float *)realloc(pVVar3->pArray,(ulong)uVar7 << 3);
        }
        pVVar3->pArray = pfVar11;
        pVVar3->nCap = uVar7 * 2;
      }
    }
    else {
      pfVar11 = pVVar3->pArray;
    }
    iVar9 = pVVar3->nSize;
    pVVar3->nSize = iVar9 + 1;
    pfVar11[iVar9] = (float)iVar25;
    pVVar4 = p->vQue;
    iVar25 = pVVar4->nCap;
    if (iVar25 <= pVVar4->nSize) {
      iVar9 = pVVar4->nSize + 1;
      iVar25 = iVar25 * 2;
      if (iVar25 < iVar9) {
        iVar25 = iVar9;
      }
      lVar19 = (long)iVar25;
      sVar1 = lVar19 * 4;
      if (pVVar4->pHeap == (int *)0x0) {
        piVar12 = (int *)malloc(sVar1);
      }
      else {
        piVar12 = (int *)realloc(pVVar4->pHeap,sVar1);
      }
      pVVar4->pHeap = piVar12;
      if (pVVar4->pOrder == (int *)0x0) {
        piVar13 = (int *)malloc(sVar1);
      }
      else {
        piVar13 = (int *)realloc(pVVar4->pOrder,sVar1);
        piVar12 = pVVar4->pHeap;
      }
      pVVar4->pOrder = piVar13;
      memset(piVar12 + pVVar4->nCap,0xff,(lVar19 - pVVar4->nCap) * 4);
      memset(pVVar4->pOrder + pVVar4->nCap,0xff,(lVar19 - pVVar4->nCap) * 4);
      pVVar4->nCap = iVar25;
    }
    if (iVar25 <= iVar18) {
      iVar10 = iVar18 + 1;
      iVar6 = iVar25 * 2;
      iVar9 = iVar25 * -2;
      iVar25 = iVar6;
      if (iVar10 != iVar6 && SBORROW4(iVar10,iVar6) == iVar10 + iVar9 < 0) {
        iVar25 = iVar10;
      }
      lVar19 = (long)iVar25;
      sVar1 = lVar19 * 4;
      if (pVVar4->pHeap == (int *)0x0) {
        piVar12 = (int *)malloc(sVar1);
      }
      else {
        piVar12 = (int *)realloc(pVVar4->pHeap,sVar1);
      }
      pVVar4->pHeap = piVar12;
      if (pVVar4->pOrder == (int *)0x0) {
        piVar13 = (int *)malloc(sVar1);
      }
      else {
        piVar13 = (int *)realloc(pVVar4->pOrder,sVar1);
        piVar12 = pVVar4->pHeap;
      }
      pVVar4->pOrder = piVar13;
      memset(piVar12 + pVVar4->nCap,0xff,(lVar19 - pVVar4->nCap) * 4);
      memset(pVVar4->pOrder + pVVar4->nCap,0xff,(lVar19 - pVVar4->nCap) * 4);
      pVVar4->nCap = iVar25;
    }
    iVar9 = pVVar4->nSize;
    if (iVar25 <= iVar9) {
      __assert_fail("p->nSize < p->nCap",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecQue.h"
                    ,0xe3,"void Vec_QuePush(Vec_Que_t *, int)");
    }
    piVar12 = pVVar4->pOrder;
    if (piVar12[iVar18] != -1) {
      __assert_fail("p->pOrder[v] == -1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecQue.h"
                    ,0xe4,"void Vec_QuePush(Vec_Que_t *, int)");
    }
    piVar13 = pVVar4->pHeap;
    if (piVar13[iVar9] != -1) {
      __assert_fail("p->pHeap[p->nSize] == -1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecQue.h"
                    ,0xe5,"void Vec_QuePush(Vec_Que_t *, int)");
    }
    piVar12[iVar18] = iVar9;
    iVar25 = pVVar4->nSize;
    pVVar4->nSize = iVar25 + 1;
    piVar13[iVar25] = iVar18;
    pfVar11 = *pVVar4->pCostsFlt;
    if (pfVar11 == (float *)0x0) {
      fVar27 = (float)iVar18;
    }
    else {
      fVar27 = pfVar11[iVar18];
    }
    uVar7 = piVar12[iVar18];
    uVar21 = (ulong)(int)uVar7;
    if (uVar21 == 0xffffffffffffffff) {
      __assert_fail("p->pOrder[v] != -1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecQue.h"
                    ,0xa5,"int Vec_QueMoveUp(Vec_Que_t *, int)");
    }
    if (piVar13[uVar21] != iVar18) {
      __assert_fail("p->pHeap[i] == v",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecQue.h"
                    ,0xa6,"int Vec_QueMoveUp(Vec_Que_t *, int)");
    }
    if (1 < (int)uVar7) {
      uVar23 = (ulong)uVar7;
      uVar22 = uVar21;
      do {
        uVar20 = (uint)uVar22;
        uVar23 = uVar23 >> 1;
        iVar25 = piVar13[uVar23];
        if (pfVar11 == (float *)0x0) {
          fVar28 = (float)iVar25;
        }
        else {
          fVar28 = pfVar11[iVar25];
        }
        uVar21 = uVar22 & 0xffffffff;
        uVar7 = uVar20;
        if (fVar27 <= fVar28) break;
        piVar13[uVar22 & 0xffffffff] = iVar25;
        piVar12[iVar25] = uVar20;
        uVar7 = (uint)uVar23;
        uVar22 = uVar23;
        uVar21 = uVar23;
      } while (3 < uVar20);
    }
    piVar13[uVar21] = iVar18;
    piVar12[iVar18] = uVar7;
  }
  else {
    if ((iVar18 < 0) || (iVar8 <= iVar18)) goto LAB_005e7b1d;
    uVar7 = p->vCoefs->pArray[uVar21];
    uVar23 = (ulong)uVar7;
    p_00 = p->pHashC;
    if (uVar23 != 0) {
      if (((int)uVar7 < 0) || (p_00->vMap->nSize <= (int)uVar7)) goto LAB_005e7b1d;
      iVar8 = p_00->vMap->pArray[uVar23];
      lVar19 = (long)iVar8;
      if ((lVar19 < 0) || (p_00->vData->nSize <= iVar8)) {
LAB_005e7afe:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      piVar13 = p_00->vData->pArray;
      piVar12 = piVar13 + lVar19;
      iVar8 = *piVar12;
      (p_00->vTemp).nCap = iVar8;
      (p_00->vTemp).nSize = iVar8;
      (p_00->vTemp).pArray = piVar12 + 2;
      if (0 < iVar8) {
        piVar13 = piVar13 + lVar19;
        lVar19 = 0;
LAB_005e75a5:
        uVar20 = piVar13[lVar19 + 2];
        if (uVar20 == 0) {
LAB_005e7adf:
          __assert_fail("New != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecPolyn.c"
                        ,199,"void Gia_PolynMergeConstOne(Vec_Int_t *, int)");
        }
        uVar26 = vTempC->nSize;
        while (uVar22 = (ulong)uVar26, 0 < (int)uVar26) {
          piVar12 = vTempC->pArray;
          uVar17 = -uVar20;
          if (0 < (int)uVar20) {
            uVar17 = uVar20;
          }
          uVar15 = 0;
          while( true ) {
            uVar2 = piVar12[uVar15];
            if (uVar2 == 0) {
              __assert_fail("Old != 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecPolyn.c"
                            ,0xca,"void Gia_PolynMergeConstOne(Vec_Int_t *, int)");
            }
            uVar14 = (uint)uVar15;
            if (uVar2 == uVar20) {
              uVar26 = uVar26 - 1;
              vTempC->nSize = uVar26;
              if (uVar14 < uVar26) {
                do {
                  piVar12[uVar15] = piVar12[uVar15 + 1];
                  uVar15 = uVar15 + 1;
                  uVar26 = vTempC->nSize;
                } while ((int)uVar15 < (int)uVar26);
              }
              uVar20 = (uVar20 - 1) + (uint)(0 < (int)uVar20) * 2;
              goto LAB_005e767a;
            }
            uVar24 = -uVar2;
            if (0 < (int)uVar2) {
              uVar24 = uVar2;
            }
            if (uVar24 == uVar17) {
              vTempC->nSize = uVar26 - 1;
              if (uVar14 < uVar26 - 1) {
                do {
                  piVar12[uVar15] = piVar12[uVar15 + 1];
                  uVar15 = uVar15 + 1;
                } while ((int)uVar15 < vTempC->nSize);
              }
              goto LAB_005e7771;
            }
            iVar8 = uVar2 + uVar20;
            if ((iVar8 == 1) || (iVar8 == -1)) break;
            uVar15 = uVar15 + 1;
            if (uVar22 == uVar15) {
              uVar15 = 0;
              goto LAB_005e76b3;
            }
          }
          if (uVar24 < uVar17) {
            uVar17 = uVar24;
          }
          uVar26 = uVar26 - 1;
          vTempC->nSize = uVar26;
          if (uVar14 < uVar26) {
            do {
              piVar12[uVar15] = piVar12[uVar15 + 1];
              uVar15 = uVar15 + 1;
              uVar26 = vTempC->nSize;
            } while ((int)uVar15 < (int)uVar26);
          }
          uVar20 = -uVar17;
          if (iVar8 == 1) {
            uVar20 = uVar17;
          }
LAB_005e767a:
          if (uVar20 == 0) goto LAB_005e7adf;
        }
        goto LAB_005e76c5;
      }
    }
LAB_005e77c6:
    iVar8 = Hsh_VecManAdd(p_00,vTempC);
    if (p->vCoefs->nSize <= iVar18) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    p->vCoefs->pArray[uVar21] = iVar8;
    if ((uVar23 != 0) && (iVar18 = -1, iVar8 == 0)) goto LAB_005e7aae;
    if (uVar23 != 0) {
      return;
    }
  }
  iVar18 = 1;
  if (iVar8 == 0) {
    return;
  }
LAB_005e7aae:
  p->nUsed = p->nUsed + iVar18;
  return;
  while (uVar15 = uVar15 + 1, uVar22 != uVar15) {
LAB_005e76b3:
    if (piVar12[uVar15] == uVar20) goto LAB_005e7771;
  }
LAB_005e76c5:
  if (uVar26 == vTempC->nCap) {
    if ((int)uVar26 < 0x10) {
      if (vTempC->pArray == (int *)0x0) {
        piVar12 = (int *)malloc(0x40);
      }
      else {
        piVar12 = (int *)realloc(vTempC->pArray,0x40);
      }
      vTempC->pArray = piVar12;
      uVar26 = 0x10;
    }
    else {
      uVar26 = uVar26 * 2;
      if (vTempC->pArray == (int *)0x0) {
        piVar12 = (int *)malloc((ulong)uVar26 * 4);
      }
      else {
        piVar12 = (int *)realloc(vTempC->pArray,(ulong)uVar26 * 4);
      }
      vTempC->pArray = piVar12;
    }
    if (piVar12 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    vTempC->nCap = uVar26;
    uVar22 = (ulong)(uint)vTempC->nSize;
  }
  else {
    piVar12 = vTempC->pArray;
  }
  vTempC->nSize = (int)uVar22 + 1;
  if (0 < (int)uVar22) {
    do {
      if (piVar12[uVar22 - 1] <= (int)uVar20) goto LAB_005e7766;
      piVar12[uVar22] = piVar12[uVar22 - 1];
      bVar5 = 1 < uVar22;
      uVar22 = uVar22 - 1;
    } while (bVar5);
    uVar22 = 0;
  }
LAB_005e7766:
  piVar12[(int)uVar22] = uVar20;
  p_00 = p->pHashC;
LAB_005e7771:
  if (p_00->vMap->nSize <= (int)uVar7) goto LAB_005e7b1d;
  iVar8 = p_00->vMap->pArray[uVar23];
  lVar16 = (long)iVar8;
  if ((lVar16 < 0) || (p_00->vData->nSize <= iVar8)) goto LAB_005e7afe;
  piVar12 = p_00->vData->pArray;
  piVar13 = piVar12 + lVar16;
  iVar8 = *piVar13;
  (p_00->vTemp).nCap = iVar8;
  (p_00->vTemp).nSize = iVar8;
  (p_00->vTemp).pArray = piVar12 + lVar16 + 2;
  lVar19 = lVar19 + 1;
  if (iVar8 <= lVar19) goto LAB_005e77c6;
  goto LAB_005e75a5;
}

Assistant:

static inline void Gia_PolynBuildAdd( Pln_Man_t * p, Vec_Int_t * vTempC, Vec_Int_t * vTempM )
{
    int iConst, iConstNew, iMono = vTempM ? Hsh_VecManAdd(p->pHashM, vTempM) : 0;
    p->nBuilds++;
    if ( iMono == Vec_IntSize(p->vCoefs) ) // new monomial
    {
        iConst = Hsh_VecManAdd( p->pHashC, vTempC );
        Vec_IntPush( p->vCoefs, iConst );
//        Vec_FltPush( p->vCounts, Vec_IntEntryLast(vTempM) );
        Vec_FltPush( p->vCounts, (float)Vec_IntEntry(p->vOrder, Vec_IntEntryLast(vTempM)) );
        Vec_QuePush( p->vQue, iMono );
//        Vec_QueUpdate( p->vQue, iMono );
        if ( iConst )
            p->nUsed++;
        return;
    }
    // this monomial exists
    iConst = Vec_IntEntry( p->vCoefs, iMono );
    if ( iConst )
        Gia_PolynMergeConst( vTempC, p, iConst );
    iConstNew = Hsh_VecManAdd( p->pHashC, vTempC );
    Vec_IntWriteEntry( p->vCoefs, iMono, iConstNew );
    if ( iConst && !iConstNew )
        p->nUsed--;
    else if ( !iConst && iConstNew )
        p->nUsed++;
    //assert( p->nUsed == Vec_IntSize(p->vCoefs) - Vec_IntCountZero(p->vCoefs) );
}